

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int parse_record(ptls_t *tls,st_ptls_record_t *rec,uint8_t *src,size_t *len)

{
  anon_struct_64_2_7cec4369_for_recvbuf *buf;
  size_t *psVar1;
  uint8_t uVar2;
  size_t sVar3;
  uint8_t *puVar4;
  ushort uVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  uint8_t *puVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (*len == 0) {
    __assert_fail("*len != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x13ba,
                  "int parse_record(ptls_t *, struct st_ptls_record_t *, const uint8_t *, size_t *)"
                 );
  }
  if ((tls->recvbuf).rec.base == (uint8_t *)0x0) {
    if ((*src & 0xfc) != 0x14) {
      return 0x32;
    }
    if (4 < *len) {
      uVar2 = *src;
      rec->type = uVar2;
      rec->version = *(ushort *)(src + 1) << 8 | *(ushort *)(src + 1) >> 8;
      uVar5 = *(ushort *)(src + 3) << 8 | *(ushort *)(src + 3) >> 8;
      uVar11 = (ulong)uVar5;
      rec->length = uVar11;
      uVar8 = (ulong)(uVar2 == '\x17') << 8 | 0x4000;
      iVar6 = 0x32;
      if (uVar11 <= uVar8) {
        iVar6 = 0;
      }
      if ((uint)uVar8 < (uint)uVar5) {
        return iVar6;
      }
      puVar9 = (uint8_t *)(uVar11 + 5);
      if (puVar9 <= (uint8_t *)*len) {
        rec->fragment = src + 5;
        iVar6 = 0;
        goto LAB_0011d1bd;
      }
    }
  }
  buf = &tls->recvbuf;
  sVar3 = *len;
  rec->type = '\0';
  rec->field_0x1 = 0;
  rec->version = 0;
  *(undefined4 *)&rec->field_0x4 = 0;
  rec->length = 0;
  rec->fragment = (uint8_t *)0x0;
  if ((buf->rec).base == (uint8_t *)0x0) {
    (tls->recvbuf).rec.base = "";
    (tls->recvbuf).rec.capacity = 0;
    (tls->recvbuf).rec.off = 0;
    (tls->recvbuf).rec.is_allocated = '\0';
    (tls->recvbuf).rec.align_bits = '\0';
    iVar6 = ptls_buffer_reserve_aligned(&buf->rec,5,'\0');
    if (iVar6 != 0) {
      return iVar6;
    }
  }
  uVar11 = (tls->recvbuf).rec.off;
  sVar7 = sVar3;
  puVar9 = src;
  while (uVar11 < 5) {
    if (sVar7 == 0) {
      return 0x202;
    }
    uVar2 = *puVar9;
    puVar9 = puVar9 + 1;
    puVar4 = (tls->recvbuf).rec.base;
    (tls->recvbuf).rec.off = uVar11 + 1;
    puVar4[uVar11] = uVar2;
    sVar7 = sVar7 - 1;
    uVar11 = (tls->recvbuf).rec.off;
  }
  puVar4 = (buf->rec).base;
  uVar2 = *puVar4;
  rec->type = uVar2;
  rec->version = *(ushort *)(puVar4 + 1) << 8 | *(ushort *)(puVar4 + 1) >> 8;
  uVar5 = *(ushort *)(puVar4 + 3) << 8 | *(ushort *)(puVar4 + 3) >> 8;
  uVar8 = (ulong)uVar5;
  rec->length = uVar8;
  uVar10 = (ulong)(uVar2 == '\x17') << 8 | 0x4000;
  iVar6 = 0x32;
  if (uVar8 <= uVar10) {
    iVar6 = 0;
  }
  if ((uint)uVar10 < (uint)uVar5) {
    return iVar6;
  }
  uVar11 = (uVar8 + 5) - uVar11;
  if (uVar11 != 0) {
    iVar6 = ptls_buffer_reserve_aligned(&buf->rec,uVar11,'\0');
    if (iVar6 != 0) {
      return iVar6;
    }
    uVar8 = (long)(src + sVar3) - (long)puVar9;
    if (uVar11 < uVar8) {
      uVar8 = uVar11;
    }
    if (uVar8 != 0) {
      memcpy((tls->recvbuf).rec.base + (tls->recvbuf).rec.off,puVar9,uVar8);
      psVar1 = &(tls->recvbuf).rec.off;
      *psVar1 = *psVar1 + uVar8;
      puVar9 = puVar9 + uVar8;
    }
  }
  iVar6 = 0x202;
  if ((tls->recvbuf).rec.off == rec->length + 5) {
    rec->fragment = (buf->rec).base + 5;
    iVar6 = 0;
  }
  puVar9 = puVar9 + (*len - (long)(src + sVar3));
LAB_0011d1bd:
  *len = (size_t)puVar9;
  return iVar6;
}

Assistant:

static int parse_record(ptls_t *tls, struct st_ptls_record_t *rec, const uint8_t *src, size_t *len)
{
    int ret;

    assert(*len != 0);

    /* Check if the first byte is something that we can handle, otherwise do not bother parsing / buffering the entire record as it
     * is obviously broken. SSL 2.0 handshakes fall into this path as well. */
    if (tls->recvbuf.rec.base == NULL) {
        uint8_t type = src[0];
        switch (type) {
        case PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC:
        case PTLS_CONTENT_TYPE_ALERT:
        case PTLS_CONTENT_TYPE_HANDSHAKE:
        case PTLS_CONTENT_TYPE_APPDATA:
            break;
        default:
            return PTLS_ALERT_DECODE_ERROR;
        }
    }

    if (tls->recvbuf.rec.base == NULL && *len >= 5) {
        /* fast path */
        if ((ret = parse_record_header(rec, src)) != 0)
            return ret;
        if (5 + rec->length <= *len) {
            rec->fragment = src + 5;
            *len = rec->length + 5;
            return 0;
        }
    }

    /* slow path */
    const uint8_t *const end = src + *len;
    *rec = (struct st_ptls_record_t){0};

    if (tls->recvbuf.rec.base == NULL) {
        ptls_buffer_init(&tls->recvbuf.rec, "", 0);
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.rec, 5)) != 0)
            return ret;
    }

    /* fill and parse the header */
    while (tls->recvbuf.rec.off < 5) {
        if (src == end)
            return PTLS_ERROR_IN_PROGRESS;
        tls->recvbuf.rec.base[tls->recvbuf.rec.off++] = *src++;
    }
    if ((ret = parse_record_header(rec, tls->recvbuf.rec.base)) != 0)
        return ret;

    /* fill the fragment */
    size_t addlen = rec->length + 5 - tls->recvbuf.rec.off;
    if (addlen != 0) {
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.rec, addlen)) != 0)
            return ret;
        if (addlen > (size_t)(end - src))
            addlen = end - src;
        if (addlen != 0) {
            memcpy(tls->recvbuf.rec.base + tls->recvbuf.rec.off, src, addlen);
            tls->recvbuf.rec.off += addlen;
            src += addlen;
        }
    }

    /* set rec->fragment if a complete record has been parsed */
    if (tls->recvbuf.rec.off == rec->length + 5) {
        rec->fragment = tls->recvbuf.rec.base + 5;
        ret = 0;
    } else {
        ret = PTLS_ERROR_IN_PROGRESS;
    }

    *len -= end - src;
    return ret;
}